

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O1

void __thiscall
shaping_clipper::limit_clip_spectrum(shaping_clipper *this,float *clip_spectrum,float *mask_curve)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  
  fVar6 = ABS(*clip_spectrum) / *mask_curve;
  if (1.0 < fVar6) {
    *clip_spectrum = *clip_spectrum / fVar6;
  }
  uVar4 = (this->oversample * this->size) / 2;
  uVar2 = this->size / 2 + 1;
  if ((int)uVar4 <= (int)uVar2) {
    uVar2 = uVar4;
  }
  uVar5 = 1;
  if (1 < (int)uVar2) {
    uVar5 = 1;
    do {
      fVar6 = cabsf((float)*(undefined8 *)(clip_spectrum + uVar5 * 2));
      fVar6 = (fVar6 + fVar6) / mask_curve[uVar5];
      if (1.0 < fVar6) {
        fVar1 = clip_spectrum[uVar5 * 2 + 1];
        clip_spectrum[uVar5 * 2] = clip_spectrum[uVar5 * 2] / fVar6;
        clip_spectrum[uVar5 * 2 + 1] = fVar1 / fVar6;
      }
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  iVar3 = this->size / 2;
  if ((int)uVar5 == iVar3) {
    fVar6 = ABS(clip_spectrum[1]) / mask_curve[iVar3];
    if (1.0 < fVar6) {
      clip_spectrum[1] = clip_spectrum[1] / fVar6;
    }
  }
  return;
}

Assistant:

void shaping_clipper::limit_clip_spectrum(float* clip_spectrum, const float* mask_curve) {
    // bin 0
    float relative_distortion_level = std::abs(clip_spectrum[0]) / mask_curve[0];
    if (relative_distortion_level > 1.0) {
        clip_spectrum[0] /= relative_distortion_level;
    }
    // bin 1..N/2-1
    // When oversampling is on, the base nyquist bin is handled in this loop
    int i = 1;
    int bins_below_nyquist = std::min(this->size * this->oversample / 2, this->size / 2 + 1);
    for (; i < bins_below_nyquist; i++) {
        float real = clip_spectrum[i * 2];
        float imag = clip_spectrum[i * 2 + 1];
        // although the negative frequencies are omitted because they are redundant,
        // the magnitude of the positive frequencies are not doubled.
        // Multiply the magnitude by 2 to simulate adding up the + and - frequencies.
        relative_distortion_level = abs(std::complex<float>(real, imag)) * 2 / mask_curve[i];
        if (relative_distortion_level > 1.0) {
            clip_spectrum[i * 2] /= relative_distortion_level;
            clip_spectrum[i * 2 + 1] /= relative_distortion_level;
        }
    }
    // bin N/2
    // When oversampling is off, the base nyquist bins needs to be handled here.
    if (i == this->size / 2) {
        relative_distortion_level = std::abs(clip_spectrum[1]) / mask_curve[this->size / 2];
        if (relative_distortion_level > 1.0) {
            clip_spectrum[1] /= relative_distortion_level;
        }
    }
}